

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_test.cpp
# Opt level: O1

void __thiscall
Boolean_PropertiesNoIntersection_Test::TestBody(Boolean_PropertiesNoIntersection_Test *this)

{
  char *message;
  initializer_list<manifold::MeshGLP<float,_unsigned_int>_> __l;
  Manifold result;
  Manifold m0;
  Manifold m1;
  AssertionResult gtest_ar;
  MeshGL cubeUV;
  AssertHelper local_240;
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  local_238;
  Manifold local_220 [16];
  Manifold local_210 [16];
  Manifold local_200 [16];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  MeshGLP<float,_unsigned_int> local_f0;
  
  CubeUV();
  manifold::Manifold::Manifold(local_210,(MeshGLP *)&local_f0);
  local_1f0 = 0x3ff8000000000000;
  uStack_1e8 = 0x3ff8000000000000;
  local_1e0 = 0x3ff8000000000000;
  manifold::Manifold::Translate(local_200,local_210);
  manifold::Manifold::operator+(local_220,local_210);
  local_238.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)manifold::Manifold::NumProp();
  local_240.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1d8,"result.NumProp()","2",(unsigned_long *)&local_238,
             (int *)&local_240);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/boolean_test.cpp"
               ,0xa2,message);
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (local_238.
        super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_238.
                            super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  manifold::MeshGLP<float,_unsigned_int>::MeshGLP
            ((MeshGLP<float,_unsigned_int> *)local_1d8,&local_f0);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1d8;
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::vector(&local_238,__l,(allocator_type *)&local_240);
  RelatedGL(local_220,&local_238,false,false);
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::~vector(&local_238);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_1d8);
  manifold::Manifold::~Manifold(local_220);
  manifold::Manifold::~Manifold(local_200);
  manifold::Manifold::~Manifold(local_210);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&local_f0);
  return;
}

Assistant:

TEST(Boolean, PropertiesNoIntersection) {
  MeshGL cubeUV = CubeUV();
  Manifold m0(cubeUV);
  Manifold m1 = m0.Translate(vec3(1.5));
  Manifold result = m0 + m1;
  EXPECT_EQ(result.NumProp(), 2);
  RelatedGL(result, {cubeUV});
}